

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_asn1.cc
# Opt level: O2

EVP_PKEY * EVP_parse_public_key(CBS *cbs)

{
  _func_int_EVP_PKEY_ptr_CBS_ptr_CBS_ptr *p_Var1;
  int iVar2;
  EVP_PKEY_ASN1_METHOD *method;
  _Head_base<0UL,_evp_pkey_st_*,_false> pkey;
  int reason;
  pointer __p;
  uint8_t padding;
  UniquePtr<EVP_PKEY> ret;
  CBS spki;
  CBS key;
  CBS algorithm;
  
  iVar2 = CBS_get_asn1(cbs,&spki,0x20000010);
  if ((((iVar2 == 0) || (iVar2 = CBS_get_asn1(&spki,&algorithm,0x20000010), iVar2 == 0)) ||
      (iVar2 = CBS_get_asn1(&spki,&key,3), iVar2 == 0)) || (spki.len != 0)) {
    iVar2 = 0x40;
  }
  else {
    method = parse_key_type(&algorithm);
    if (method == (EVP_PKEY_ASN1_METHOD *)0x0) {
      iVar2 = 0x45;
      reason = 0x80;
      goto LAB_00250b62;
    }
    iVar2 = CBS_get_u8(&key,&padding);
    if ((iVar2 != 0) && (padding == '\0')) {
      pkey._M_head_impl = (evp_pkey_st *)EVP_PKEY_new();
      ret._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)pkey._M_head_impl;
      if ((tuple<evp_pkey_st_*,_bssl::internal::Deleter>)pkey._M_head_impl !=
          (_Head_base<0UL,_evp_pkey_st_*,_false>)0x0) {
        evp_pkey_set_method(pkey._M_head_impl,method);
        p_Var1 = (pkey._M_head_impl)->ameth->pub_decode;
        if (p_Var1 == (_func_int_EVP_PKEY_ptr_CBS_ptr_CBS_ptr *)0x0) {
          pkey._M_head_impl = (evp_pkey_st *)0x0;
          ERR_put_error(6,0,0x80,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_asn1.cc"
                        ,0x59);
          goto LAB_00250bbe;
        }
        iVar2 = (*p_Var1)(pkey._M_head_impl,&algorithm,&key);
        if (iVar2 != 0) {
          ret._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl =
               (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)
               (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)0x0;
          goto LAB_00250bbe;
        }
      }
      pkey._M_head_impl = (evp_pkey_st *)0x0;
LAB_00250bbe:
      std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&ret);
      return pkey._M_head_impl;
    }
    iVar2 = 0x4c;
  }
  reason = 0x66;
LAB_00250b62:
  ERR_put_error(6,0,reason,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_asn1.cc"
                ,iVar2);
  return (EVP_PKEY *)0x0;
}

Assistant:

EVP_PKEY *EVP_parse_public_key(CBS *cbs) {
  // Parse the SubjectPublicKeyInfo.
  CBS spki, algorithm, key;
  uint8_t padding;
  if (!CBS_get_asn1(cbs, &spki, CBS_ASN1_SEQUENCE) ||
      !CBS_get_asn1(&spki, &algorithm, CBS_ASN1_SEQUENCE) ||
      !CBS_get_asn1(&spki, &key, CBS_ASN1_BITSTRING) ||
      CBS_len(&spki) != 0) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return nullptr;
  }
  const EVP_PKEY_ASN1_METHOD *method = parse_key_type(&algorithm);
  if (method == nullptr) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_UNSUPPORTED_ALGORITHM);
    return nullptr;
  }
  if (// Every key type defined encodes the key as a byte string with the same
      // conversion to BIT STRING.
      !CBS_get_u8(&key, &padding) ||
      padding != 0) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return nullptr;
  }

  // Set up an |EVP_PKEY| of the appropriate type.
  bssl::UniquePtr<EVP_PKEY> ret(EVP_PKEY_new());
  if (ret == nullptr) {
    return nullptr;
  }
  evp_pkey_set_method(ret.get(), method);

  // Call into the type-specific SPKI decoding function.
  if (ret->ameth->pub_decode == nullptr) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_UNSUPPORTED_ALGORITHM);
    return nullptr;
  }
  if (!ret->ameth->pub_decode(ret.get(), &algorithm, &key)) {
    return nullptr;
  }

  return ret.release();
}